

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O3

mbedtls_mpi_uint
mbedtls_mpi_core_add(mbedtls_mpi_uint *X,mbedtls_mpi_uint *A,mbedtls_mpi_uint *B,size_t limbs)

{
  ulong uVar1;
  mbedtls_mpi_uint mVar2;
  size_t sVar3;
  
  if (limbs == 0) {
    mVar2 = 0;
  }
  else {
    mVar2 = 0;
    sVar3 = 0;
    do {
      uVar1 = mVar2 + A[sVar3];
      mVar2 = (ulong)CARRY8(uVar1,B[sVar3]) + (ulong)CARRY8(mVar2,A[sVar3]);
      X[sVar3] = uVar1 + B[sVar3];
      sVar3 = sVar3 + 1;
    } while (limbs != sVar3);
  }
  return mVar2;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_add(mbedtls_mpi_uint *X,
                                      const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *B,
                                      size_t limbs)
{
    mbedtls_mpi_uint c = 0;

    for (size_t i = 0; i < limbs; i++) {
        mbedtls_mpi_uint t = c + A[i];
        c = (t < A[i]);
        t += B[i];
        c += (t < B[i]);
        X[i] = t;
    }

    return c;
}